

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_endpoint_refiner.cpp
# Opt level: O1

bool __thiscall
crnlib::dxt_endpoint_refiner::refine(dxt_endpoint_refiner *this,params *p,results *r)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  color_quad_u8 *pcVar4;
  uint8 *puVar5;
  double dVar6;
  float fVar7;
  uint i_4;
  ulong uVar8;
  uint i;
  undefined8 *puVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  float fVar16;
  undefined1 auVar17 [16];
  double dVar18;
  vec3F l;
  vec3F h;
  vec<3U,_double> a;
  vec<3U,_double> b;
  vec<3U,_double> betax_sum;
  vec<3U,_double> alphax_sum;
  vec<3U,_double> first_color;
  vec<3U,_double> result_5;
  double local_148;
  double adStack_140 [2];
  double local_130;
  float local_128;
  double local_118 [4];
  double local_f8 [4];
  double local_d8 [4];
  double local_b8 [4];
  double local_98;
  double dStack_90;
  double local_88;
  double adStack_80 [3];
  vec3F local_68;
  double local_58;
  float local_50;
  double local_48;
  float local_40;
  double local_38;
  float local_30;
  long lVar15;
  
  if (p->m_num_pixels == 0) {
    return false;
  }
  this->m_pParams = p;
  this->m_pResults = r;
  r->m_error = 0xffffffffffffffff;
  r->m_low_color = 0;
  r->m_high_color = 0;
  local_b8[2] = 0.0;
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  local_d8[2] = 0.0;
  local_d8[0] = 0.0;
  local_d8[1] = 0.0;
  local_88 = 0.0;
  local_98 = 0.0;
  dStack_90 = 0.0;
  uVar2 = p->m_num_pixels;
  dVar11 = 0.0;
  dVar12 = 0.0;
  dVar6 = 0.0;
  if ((ulong)uVar2 != 0) {
    pcVar4 = p->m_pPixels;
    bVar1 = p->m_dxt1_selectors;
    uVar3 = p->m_alpha_comp_index;
    if (bVar1 == false) {
      fVar16 = 7.0;
    }
    else {
      fVar16 = 3.0;
    }
    puVar5 = p->m_pSelectors;
    uVar8 = 0;
    dVar6 = 0.0;
    do {
      puVar9 = &g_dxt5_to_linear;
      if (bVar1 == false) {
        dVar13 = (double)((float)pcVar4[uVar8].field_0.c[uVar3] / 255.0);
        lVar10 = 0;
        auVar14 = _DAT_001b10a0;
        do {
          if (SUB164(auVar14 ^ _DAT_001b10b0,4) == -0x80000000 &&
              SUB164(auVar14 ^ _DAT_001b10b0,0) < -0x7ffffffd) {
            (&local_148)[lVar10] = dVar13;
            adStack_140[lVar10] = dVar13;
          }
          lVar10 = lVar10 + 2;
          lVar15 = auVar14._8_8_;
          auVar14._0_8_ = auVar14._0_8_ + 2;
          auVar14._8_8_ = lVar15 + 2;
        } while (lVar10 != 4);
      }
      else {
        puVar9 = (undefined8 *)&g_dxt1_to_linear;
        auVar17._0_4_ = (float)(*(ushort *)&pcVar4[uVar8].field_0 & 0xff);
        auVar17._4_4_ = (float)(byte)(*(ushort *)&pcVar4[uVar8].field_0 >> 8);
        auVar17._8_8_ = 0;
        auVar17 = divps(auVar17,_DAT_001ba770);
        local_148 = (double)auVar17._0_4_;
        adStack_140[0] = (double)auVar17._4_4_;
        adStack_140[1] = (double)((float)pcVar4[uVar8].field_0.field_0.b / 255.0);
      }
      if (uVar8 == 0) {
        local_88 = adStack_140[1];
        local_98 = local_148;
        dStack_90 = adStack_140[0];
      }
      dVar18 = (double)((float)*(byte *)((long)puVar9 + (ulong)puVar5[uVar8]) / fVar16);
      dVar13 = 1.0 - dVar18;
      lVar10 = 0;
      do {
        (&local_130)[lVar10] = (&local_148)[lVar10] * dVar13;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      dVar12 = dVar12 + dVar18 * dVar18;
      lVar10 = 0;
      do {
        local_b8[lVar10] = (&local_130)[lVar10] + local_b8[lVar10];
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      dVar6 = dVar6 + dVar13 * dVar13;
      lVar10 = 0;
      do {
        (&local_130)[lVar10] = (&local_148)[lVar10] * dVar18;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      lVar10 = 0;
      do {
        local_d8[lVar10] = (&local_130)[lVar10] + local_d8[lVar10];
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      dVar11 = dVar11 + dVar13 * dVar18;
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar2);
  }
  if ((dVar12 != 0.0) || (NAN(dVar12))) {
    if ((dVar6 != 0.0) || (NAN(dVar6))) {
      dVar13 = dVar12 * dVar6 - dVar11 * dVar11;
      if ((dVar13 != 0.0) || (NAN(dVar13))) {
        lVar10 = 0;
        do {
          (&local_130)[lVar10] = local_b8[lVar10] * dVar12;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 3);
        lVar10 = 0;
        do {
          adStack_80[lVar10] = local_d8[lVar10] * dVar11;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 3);
        lVar10 = 0;
        do {
          (&local_148)[lVar10] = (&local_130)[lVar10] - adStack_80[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 3);
        lVar10 = 0;
        do {
          local_118[lVar10] = (&local_148)[lVar10] / dVar13;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 3);
        lVar10 = 0;
        do {
          (&local_130)[lVar10] = local_d8[lVar10] * dVar6;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 3);
        lVar10 = 0;
        do {
          adStack_80[lVar10] = local_b8[lVar10] * dVar11;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 3);
        lVar10 = 0;
        do {
          (&local_148)[lVar10] = (&local_130)[lVar10] - adStack_80[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 3);
        lVar10 = 0;
        do {
          local_f8[lVar10] = (&local_148)[lVar10] / dVar13;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 3);
      }
      else {
        local_118[2] = local_88;
        local_118[0] = local_98;
        local_118[1] = dStack_90;
        local_f8[0] = local_98;
        local_f8[1] = dStack_90;
        local_f8[2] = local_88;
      }
    }
    else {
      local_118[0] = 0.0;
      local_118[1] = 0.0;
      local_118[2] = 0.0;
      lVar10 = 0;
      do {
        local_f8[lVar10] = local_d8[lVar10] / dVar12;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
    }
  }
  else {
    lVar10 = 0;
    do {
      (&local_148)[lVar10] = local_b8[lVar10] / dVar6;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    local_118[2] = adStack_140[1];
    local_118[0] = local_148;
    local_118[1] = adStack_140[0];
    local_f8[0] = 0.0;
    local_f8[1] = 0.0;
    local_f8[2] = 0.0;
  }
  lVar10 = 0;
  adStack_140[0] = (double)((ulong)adStack_140[0] & 0xffffffff00000000);
  local_148 = 0.0;
  local_128 = 0.0;
  local_130 = 0.0;
  do {
    *(float *)((long)&local_148 + lVar10 * 4) = (float)local_118[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    *(float *)((long)&local_130 + lVar10 * 4) = (float)local_f8[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    fVar16 = *(float *)((long)&local_148 + lVar10 * 4);
    fVar7 = 1.0;
    if (fVar16 <= 1.0) {
      fVar7 = fVar16;
    }
    *(uint *)((long)&local_148 + lVar10 * 4) = ~-(uint)(fVar16 < 0.0) & (uint)fVar7;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    fVar16 = *(float *)((long)&local_130 + lVar10 * 4);
    fVar7 = 1.0;
    if (fVar16 <= 1.0) {
      fVar7 = fVar16;
    }
    *(uint *)((long)&local_130 + lVar10 * 4) = ~-(uint)(fVar16 < 0.0) & (uint)fVar7;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  if (p->m_dxt1_selectors == false) {
    local_50 = adStack_140[0]._0_4_;
    local_58 = local_148;
    local_68.m_s._0_8_ = local_130;
    local_68.m_s[2] = local_128;
    optimize_dxt5(this,(vec3F *)&local_58,&local_68);
  }
  else {
    local_30 = adStack_140[0]._0_4_;
    local_38 = local_148;
    local_48 = local_130;
    local_40 = local_128;
    optimize_dxt1(this,(vec3F *)&local_38,(vec3F *)&local_48);
  }
  return r->m_error < p->m_error_to_beat;
}

Assistant:

bool dxt_endpoint_refiner::refine(const params& p, results& r) {
  if (!p.m_num_pixels)
    return false;

  m_pParams = &p;
  m_pResults = &r;

  r.m_error = cUINT64_MAX;
  r.m_low_color = 0;
  r.m_high_color = 0;

  double alpha2_sum = 0.0f;
  double beta2_sum = 0.0f;
  double alphabeta_sum = 0.0f;

  vec<3, double> alphax_sum(0.0f);
  vec<3, double> betax_sum(0.0f);

  vec<3, double> first_color(0.0f);

  // This linear solver is from Squish.
  for (uint i = 0; i < p.m_num_pixels; ++i) {
    uint8 c = p.m_pSelectors[i];

    double k;
    if (p.m_dxt1_selectors)
      k = g_dxt1_to_linear[c] * 1.0f / 3.0f;
    else
      k = g_dxt5_to_linear[c] * 1.0f / 7.0f;

    double alpha = 1.0f - k;
    double beta = k;

    vec<3, double> x;

    if (p.m_dxt1_selectors)
      x.set(p.m_pPixels[i][0] * 1.0f / 255.0f, p.m_pPixels[i][1] * 1.0f / 255.0f, p.m_pPixels[i][2] * 1.0f / 255.0f);
    else
      x.set(p.m_pPixels[i][p.m_alpha_comp_index] / 255.0f);

    if (!i)
      first_color = x;

    alpha2_sum += alpha * alpha;
    beta2_sum += beta * beta;
    alphabeta_sum += alpha * beta;
    alphax_sum += alpha * x;
    betax_sum += beta * x;
  }

  // zero where non-determinate
  vec<3, double> a, b;
  if (beta2_sum == 0.0f) {
    a = alphax_sum / alpha2_sum;
    b.clear();
  } else if (alpha2_sum == 0.0f) {
    a.clear();
    b = betax_sum / beta2_sum;
  } else {
    double factor = alpha2_sum * beta2_sum - alphabeta_sum * alphabeta_sum;
    if (factor != 0.0f) {
      a = (alphax_sum * beta2_sum - betax_sum * alphabeta_sum) / factor;
      b = (betax_sum * alpha2_sum - alphax_sum * alphabeta_sum) / factor;
    } else {
      a = first_color;
      b = first_color;
    }
  }

  vec3F l(0.0f), h(0.0f);
  l = a;
  h = b;

  l.clamp(0.0f, 1.0f);
  h.clamp(0.0f, 1.0f);

  if (p.m_dxt1_selectors)
    optimize_dxt1(l, h);
  else
    optimize_dxt5(l, h);

  return r.m_error < p.m_error_to_beat;
}